

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O2

void highbd_mul_shift_avx2(__m256i *x,__m256i *y,__m256i *p,int shift)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar1 = vpmuldq_avx2((undefined1  [32])*y,(undefined1  [32])*x);
  auVar3 = vpsrlq_avx2((undefined1  [32])*x,0x20);
  auVar4 = vpsrlq_avx2((undefined1  [32])*y,0x20);
  auVar3 = vpmuldq_avx2(auVar4,auVar3);
  auVar1 = vpsrlq_avx2(auVar1,ZEXT416((uint)shift));
  auVar3 = vpsrlq_avx2(auVar3,ZEXT416((uint)shift));
  auVar3 = vpsllq_avx2(auVar3,0x20);
  alVar2 = (__m256i)vpblendd_avx2(auVar1,auVar3,0xaa);
  *p = alVar2;
  return;
}

Assistant:

static inline void highbd_mul_shift_avx2(const __m256i *x, const __m256i *y,
                                         __m256i *p, const int shift) {
  __m256i prod_lo = _mm256_mul_epi32(*x, *y);
  __m256i prod_hi = _mm256_srli_epi64(*x, 32);
  const __m256i mult_hi = _mm256_srli_epi64(*y, 32);
  prod_hi = _mm256_mul_epi32(prod_hi, mult_hi);

  prod_lo = _mm256_srli_epi64(prod_lo, shift);
  prod_hi = _mm256_srli_epi64(prod_hi, shift);

  prod_hi = _mm256_slli_epi64(prod_hi, 32);
  *p = _mm256_blend_epi32(prod_lo, prod_hi, 0xaa);
}